

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O3

void __thiscall BBDT<TTA>::FirstScan(BBDT<TTA> *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  uVar15 = (ulong)iVar2;
  iVar3 = *(int *)&pMVar4->field_0xc;
  lVar20 = (long)iVar3;
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  if (0 < (long)uVar15) {
    uVar13 = 0;
    do {
      if (0 < iVar3) {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar11 = **(long **)&pMVar4->field_0x48;
        lVar12 = lVar11 * uVar13 + *(long *)&pMVar4->field_0x10;
        lVar18 = lVar12 - lVar11;
        lVar16 = lVar18 - lVar11;
        lVar10 = **(long **)&pMVar5->field_0x48;
        lVar17 = lVar10 * uVar13 + *(long *)&pMVar5->field_0x10;
        lVar11 = lVar11 + lVar12;
        lVar10 = lVar17 + lVar10 * -2;
        uVar7 = uVar13 | 1;
        uVar19 = 0;
        do {
          lVar9 = lVar10;
          if (*(char *)(lVar12 + uVar19) == '\0') {
            if ((uVar7 < uVar15) && (*(char *)(lVar11 + uVar19) != '\0')) {
              uVar8 = uVar19 | 1;
              if ((lVar20 <= (long)uVar8) || (*(char *)(lVar12 + uVar8) == '\0')) {
                if ((uVar19 != 0) &&
                   ((*(char *)((uVar19 - 1) + lVar11) != '\0' ||
                    (*(char *)(lVar12 + -1 + uVar19) != '\0')))) goto LAB_0019fd01;
                goto LAB_0019f9ea;
              }
              if (uVar19 == 0) {
LAB_0019f6cb:
                if (uVar13 == 0) goto LAB_0019f9ea;
                if (*(char *)(lVar18 + (uVar19 | 1)) == '\0') {
                  if (((long)(uVar19 + 2) < lVar20) && (*(char *)(lVar18 + uVar19 + 2) != '\0')) {
                    if (*(char *)(lVar18 + uVar19) == '\0') goto LAB_0019fad9;
                    goto LAB_0019f883;
                  }
                  if (*(char *)(lVar18 + uVar19) == '\0') goto LAB_0019f9ea;
                }
                goto LAB_0019f9e1;
              }
              if (*(char *)((uVar19 - 1) + lVar12) != '\0') {
                if (uVar13 != 0) {
                  if (*(char *)(lVar18 + uVar8) != '\0') goto LAB_0019f5fe;
                  if (((long)(uVar19 + 2) < lVar20) && (*(char *)(lVar18 + uVar19 + 2) != '\0')) {
                    if (*(char *)(lVar16 + uVar8) == '\0') {
                      uVar6 = *(uint *)(lVar10 + 8 + uVar19 * 4);
                      goto LAB_0019fc9c;
                    }
                    if (*(char *)(lVar18 + uVar19) == '\0') goto LAB_0019f756;
LAB_0019fb92:
                    uVar6 = *(uint *)(lVar17 + -8 + uVar19 * 4);
LAB_0019fcb0:
                    *(uint *)(lVar17 + uVar19 * 4) = uVar6;
                    goto LAB_0019fd0a;
                  }
                }
                goto LAB_0019fd01;
              }
              if (*(char *)(lVar11 + -1 + uVar19) == '\0') goto LAB_0019f6cb;
              if (uVar13 == 0) goto LAB_0019fd01;
              if (*(char *)(lVar18 + uVar8) != '\0') {
                if (*(char *)((uVar19 - 2) + lVar12) == '\0') {
LAB_0019fc93:
                  uVar6 = *(uint *)(lVar10 + uVar19 * 4);
LAB_0019fc9c:
                  uVar6 = TTA::Merge(uVar6,*(uint *)(lVar17 + -8 + uVar19 * 4));
                  goto LAB_0019fcb0;
                }
                if (*(char *)(lVar18 + -1 + uVar19) != '\0') goto LAB_0019fb86;
                if ((*(char *)(lVar18 + -2 + uVar19) == '\0') ||
                   (*(char *)(lVar16 + -1 + uVar19) == '\0')) goto LAB_0019fb16;
                if (*(char *)(lVar18 + uVar19) == '\0') {
                  cVar1 = *(char *)(lVar16 + uVar19);
                  goto joined_r0x0019fa9c;
                }
LAB_0019fb0c:
                uVar6 = *(uint *)(lVar17 + -8 + uVar19 * 4);
                goto LAB_0019fefd;
              }
              if ((lVar20 <= (long)(uVar19 + 2)) || (*(char *)(lVar18 + uVar19 + 2) == '\0')) {
                if (*(char *)(lVar18 + uVar19) != '\0') {
                  if (*(char *)((uVar19 - 2) + lVar12) != '\0') {
                    if (*(char *)(lVar18 + -1 + uVar19) == '\0') goto LAB_0019fafc;
                    goto LAB_0019fb92;
                  }
                  goto LAB_0019fc93;
                }
                goto LAB_0019fd01;
              }
              if (*(char *)(lVar16 + uVar8) != '\0') {
                if ((*(char *)((uVar19 - 2) + lVar12) == '\0') ||
                   ((*(char *)(lVar18 + -1 + uVar19) == '\0' &&
                    ((*(char *)(lVar18 + -2 + uVar19) == '\0' ||
                     (*(char *)(lVar16 + -1 + uVar19) == '\0')))))) goto LAB_0019fee4;
                if (*(char *)(lVar18 + uVar19) == '\0') {
                  cVar1 = *(char *)(lVar16 + uVar19);
                  goto joined_r0x0019f999;
                }
                goto LAB_0019fb0c;
              }
              if (*(char *)(lVar18 + uVar19) == '\0') goto LAB_0019fea2;
              if (*(char *)((uVar19 - 2) + lVar12) == '\0') {
LAB_0019ff49:
                uVar6 = TTA::Merge(*(uint *)(lVar10 + uVar19 * 4),*(uint *)(lVar10 + 8 + uVar19 * 4)
                                  );
                uVar14 = *(uint *)(lVar17 + -8 + uVar19 * 4);
              }
              else {
                if (*(char *)(lVar18 + -1 + uVar19) == '\0') {
                  if (*(char *)(lVar18 + -2 + uVar19) != '\0') {
                    cVar1 = *(char *)(lVar16 + -1 + uVar19);
                    goto joined_r0x0019ff3e;
                  }
                  goto LAB_0019ff49;
                }
                uVar6 = *(uint *)(lVar10 + 8 + uVar19 * 4);
                uVar14 = *(uint *)(lVar17 + -8 + uVar19 * 4);
              }
              uVar6 = TTA::Merge(uVar6,uVar14);
              *(uint *)(lVar17 + uVar19 * 4) = uVar6;
            }
            else {
              uVar8 = uVar19 | 1;
              if ((long)uVar8 < lVar20) {
                if (*(char *)(lVar12 + uVar8) != '\0') goto LAB_0019f6cb;
                if ((uVar7 < uVar15) && (*(char *)(lVar11 + uVar8) != '\0')) goto LAB_0019f9ea;
              }
              *(undefined4 *)(lVar17 + uVar19 * 4) = 0;
            }
          }
          else {
            if (uVar19 == 0) {
LAB_0019f7f2:
              uVar8 = uVar19 | 1;
              if ((uVar13 == 0) || ((lVar20 <= (long)uVar8 || (*(char *)(lVar18 + uVar8) == '\0'))))
              {
                if (((long)uVar8 < lVar20) && (*(char *)(lVar12 + uVar8) != '\0')) {
                  if ((uVar13 == 0) || (lVar20 <= (long)(uVar19 + 2))) {
                    if (uVar13 == 0) goto LAB_0019f9ea;
                  }
                  else if (*(char *)(lVar18 + uVar19 + 2) != '\0') {
                    if (*(char *)(lVar18 + uVar19) == '\0') {
                      if ((uVar19 != 0) && (*(char *)(lVar18 + -1 + uVar19) != '\0')) {
                        if ((*(char *)(lVar16 + uVar8) != '\0') &&
                           (*(char *)(lVar16 + uVar19) != '\0')) {
                          uVar6 = *(uint *)(lVar10 + 8 + uVar19 * 4);
                          goto LAB_0019fefd;
                        }
                        uVar6 = *(uint *)(lVar10 + -8 + uVar19 * 4);
                        uVar14 = *(uint *)(lVar10 + 8 + uVar19 * 4);
                        goto LAB_0019fef3;
                      }
                    }
                    else {
LAB_0019f883:
                      if (*(char *)(lVar16 + (uVar19 | 1)) == '\0') {
                        uVar6 = *(uint *)(lVar10 + uVar19 * 4);
                        uVar14 = *(uint *)(lVar10 + 8 + uVar19 * 4);
                        goto LAB_0019fb3a;
                      }
                    }
LAB_0019fad9:
                    uVar6 = *(uint *)(lVar10 + 8 + uVar19 * 4);
                    goto LAB_0019fd06;
                  }
                  if (*(char *)(lVar18 + uVar19) != '\0') {
LAB_0019f9e1:
                    uVar6 = *(uint *)(lVar9 + uVar19 * 4);
                    goto LAB_0019fd06;
                  }
                  if (uVar13 != 0 && uVar19 != 0) {
LAB_0019f92d:
                    lVar9 = lVar10 + -8;
                    if (*(char *)(lVar18 + -1 + uVar19) != '\0') goto LAB_0019f9e1;
                  }
                }
                else if (uVar13 != 0) {
                  if (*(char *)(lVar18 + uVar19) != '\0') goto LAB_0019f9e1;
                  if (uVar19 != 0) goto LAB_0019f92d;
                }
LAB_0019f9ea:
                uVar8 = (ulong)TTA::length_;
                TTA::rtable_[uVar8] = TTA::length_;
                TTA::next_[uVar8] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar6 = TTA::length_ + 1;
                *(uint *)(lVar17 + uVar19 * 4) = TTA::length_;
                TTA::length_ = uVar6;
                goto LAB_0019fd0a;
              }
              if ((((*(char *)(lVar18 + uVar19) != '\0') || (uVar19 == 0)) ||
                  (*(char *)(lVar18 + -1 + uVar19) == '\0')) || (*(char *)(lVar16 + uVar19) != '\0')
                 ) goto LAB_0019f9e1;
              uVar6 = *(uint *)(lVar10 + -8 + uVar19 * 4);
              uVar14 = *(uint *)(lVar10 + uVar19 * 4);
LAB_0019fb3a:
              uVar6 = TTA::Merge(uVar6,uVar14);
            }
            else {
              if (*(char *)(lVar12 + -1 + uVar19) == '\0') {
                if ((uVar15 <= uVar7) || (*(char *)(lVar11 + -1 + uVar19) == '\0'))
                goto LAB_0019f7f2;
                uVar8 = uVar19 | 1;
                if (((uVar13 == 0) || (lVar20 <= (long)uVar8)) ||
                   (*(char *)(lVar18 + uVar8) == '\0')) {
                  if (((lVar20 <= (long)uVar8) || (*(char *)(lVar12 + uVar8) == '\0')) ||
                     ((uVar13 == 0 ||
                      ((lVar20 <= (long)(uVar19 + 2) || (*(char *)(lVar18 + uVar19 + 2) == '\0')))))
                     ) {
                    if (uVar13 != 0) {
                      if (*(char *)(lVar18 + -1 + uVar19) == '\0') {
                        if (*(char *)(lVar18 + uVar19) != '\0') {
                          if (*(char *)((uVar19 - 2) + lVar12) != '\0') {
LAB_0019fafc:
                            cVar1 = *(char *)(lVar18 + -2 + uVar19);
                            goto joined_r0x0019fb02;
                          }
                          goto LAB_0019fb2c;
                        }
                      }
                      else if (*(char *)((uVar19 - 2) + lVar12) == '\0') {
                        uVar6 = *(uint *)(lVar10 + -8 + uVar19 * 4);
                        goto LAB_0019fb35;
                      }
                    }
                    goto LAB_0019fd01;
                  }
                  if (*(char *)((uVar19 - 2) + lVar12) != '\0') {
                    if (*(char *)(lVar18 + -1 + uVar19) == '\0') {
                      if (*(char *)(lVar16 + uVar8) != '\0') {
                        if ((*(char *)(lVar18 + -2 + uVar19) == '\0') ||
                           (*(char *)(lVar16 + -1 + uVar19) == '\0')) {
                          uVar6 = TTA::Merge(*(uint *)(lVar10 + 8 + uVar19 * 4),
                                             *(uint *)(lVar17 + -8 + uVar19 * 4));
                        }
                        else {
                          if (*(char *)(lVar18 + uVar19) == '\0') {
                            cVar1 = *(char *)(lVar16 + uVar19);
                            goto joined_r0x0019f999;
                          }
                          uVar6 = *(uint *)(lVar17 + -8 + uVar19 * 4);
                        }
                        *(uint *)(lVar17 + uVar19 * 4) = uVar6;
                        goto LAB_0019fd0a;
                      }
                      if (*(char *)(lVar18 + uVar19) != '\0') {
                        if (*(char *)(lVar18 + -2 + uVar19) == '\0') {
                          uVar6 = *(uint *)(lVar10 + uVar19 * 4);
                          goto LAB_0019feba;
                        }
                        cVar1 = *(char *)(lVar16 + -1 + uVar19);
                        goto joined_r0x0019ff3e;
                      }
                    }
                    else if (*(char *)(lVar16 + uVar8) != '\0') {
                      if (*(char *)(lVar18 + uVar19) == '\0') {
                        cVar1 = *(char *)(lVar16 + uVar19);
joined_r0x0019f999:
                        if (cVar1 == '\0') goto LAB_0019fea2;
                      }
                      goto LAB_0019fd01;
                    }
LAB_0019fea2:
                    uVar6 = *(uint *)(lVar10 + 8 + uVar19 * 4);
                    goto LAB_0019fb35;
                  }
                  if (*(char *)(lVar18 + uVar19) != '\0') {
                    cVar1 = *(char *)(lVar16 + uVar8);
joined_r0x0019ff3e:
                    if (cVar1 != '\0') {
LAB_0019fc5a:
                      uVar6 = *(uint *)(lVar10 + 8 + uVar19 * 4);
                      goto LAB_0019fc64;
                    }
                    uVar6 = *(uint *)(lVar10 + uVar19 * 4);
LAB_0019fe09:
                    uVar14 = *(uint *)(lVar10 + 8 + uVar19 * 4);
                    goto LAB_0019fe0e;
                  }
                  if (*(char *)(lVar18 + -1 + uVar19) == '\0') goto LAB_0019fea2;
                  if (*(char *)(lVar16 + uVar8) != '\0') {
                    if (*(char *)(lVar16 + uVar19) != '\0') goto LAB_0019fc5a;
                    uVar6 = *(uint *)(lVar10 + -8 + uVar19 * 4);
                    goto LAB_0019fe09;
                  }
                  uVar6 = *(uint *)(lVar10 + -8 + uVar19 * 4);
LAB_0019feba:
                  uVar6 = TTA::Merge(uVar6,*(uint *)(lVar10 + 8 + uVar19 * 4));
                  uVar14 = *(uint *)(lVar17 + -8 + uVar19 * 4);
                }
                else {
                  if (*(char *)((uVar19 - 2) + lVar12) == '\0') {
                    if ((*(char *)(lVar18 + uVar19) == '\0') &&
                       (*(char *)(lVar18 + -1 + uVar19) != '\0')) {
                      if (*(char *)(lVar16 + uVar19) == '\0') {
                        uVar6 = *(uint *)(lVar10 + -8 + uVar19 * 4);
                        uVar14 = *(uint *)(lVar10 + uVar19 * 4);
LAB_0019fe0e:
                        uVar6 = TTA::Merge(uVar6,uVar14);
                        uVar14 = *(uint *)(lVar17 + -8 + uVar19 * 4);
                      }
                      else {
                        uVar6 = *(uint *)(lVar10 + uVar19 * 4);
LAB_0019fc64:
                        uVar14 = *(uint *)(lVar17 + -8 + uVar19 * 4);
                      }
                      uVar6 = TTA::Merge(uVar6,uVar14);
                      *(uint *)(lVar17 + uVar19 * 4) = uVar6;
                      goto LAB_0019fd0a;
                    }
                  }
                  else {
                    if (*(char *)(lVar18 + -1 + uVar19) == '\0') {
                      if ((*(char *)(lVar18 + -2 + uVar19) == '\0') ||
                         (*(char *)(lVar16 + -1 + uVar19) == '\0')) goto LAB_0019fc93;
LAB_0019fb86:
                      if (*(char *)(lVar18 + uVar19) != '\0') goto LAB_0019fb92;
                      cVar1 = *(char *)(lVar16 + uVar19);
                    }
                    else {
                      if (*(char *)(lVar18 + uVar19) != '\0') goto LAB_0019fd01;
                      cVar1 = *(char *)(lVar16 + uVar19);
                    }
joined_r0x0019fa9c:
                    if (cVar1 != '\0') goto LAB_0019fd01;
                  }
LAB_0019fb2c:
                  uVar6 = *(uint *)(lVar10 + uVar19 * 4);
LAB_0019fb35:
                  uVar14 = *(uint *)(lVar17 + -8 + uVar19 * 4);
                }
                goto LAB_0019fb3a;
              }
              uVar8 = uVar19 | 1;
              if (((uVar13 == 0) || (lVar20 <= (long)uVar8)) || (*(char *)(lVar18 + uVar8) == '\0'))
              {
                if ((((long)uVar8 < lVar20) && (*(char *)(lVar12 + uVar8) != '\0')) &&
                   ((uVar13 != 0 &&
                    (((long)(uVar19 + 2) < lVar20 && (*(char *)(lVar18 + uVar19 + 2) != '\0')))))) {
                  if (*(char *)(lVar16 + uVar8) != '\0') {
                    if (*(char *)(lVar18 + uVar19) != '\0') goto LAB_0019fb0c;
LAB_0019f756:
                    if ((*(char *)(lVar16 + uVar19) != '\0') &&
                       ((*(char *)(lVar18 + -1 + uVar19) != '\0' ||
                        ((*(char *)((uVar19 - 2) + lVar18) != '\0' &&
                         (*(char *)(lVar16 + -1 + uVar19) != '\0')))))) goto LAB_0019fb0c;
                  }
LAB_0019fee4:
                  uVar6 = *(uint *)(lVar10 + 8 + uVar19 * 4);
                  goto LAB_0019feee;
                }
              }
              else {
LAB_0019f5fe:
                if (*(char *)(lVar18 + uVar19) == '\0') {
                  if (*(char *)(lVar16 + uVar19) != '\0') {
                    if (*(char *)(lVar18 + -1 + uVar19) != '\0') goto LAB_0019fb0c;
                    cVar1 = *(char *)((uVar19 - 2) + lVar18);
joined_r0x0019fb02:
                    if ((cVar1 != '\0') && (*(char *)(lVar16 + -1 + uVar19) != '\0'))
                    goto LAB_0019fb0c;
                  }
LAB_0019fb16:
                  uVar6 = *(uint *)(lVar10 + uVar19 * 4);
LAB_0019feee:
                  uVar14 = *(uint *)(lVar17 + -8 + uVar19 * 4);
LAB_0019fef3:
                  uVar6 = TTA::Merge(uVar6,uVar14);
LAB_0019fefd:
                  *(uint *)(lVar17 + uVar19 * 4) = uVar6;
                  goto LAB_0019fd0a;
                }
              }
LAB_0019fd01:
              uVar6 = *(uint *)(lVar17 + -8 + uVar19 * 4);
            }
LAB_0019fd06:
            *(uint *)(lVar17 + uVar19 * 4) = uVar6;
          }
LAB_0019fd0a:
          uVar19 = uVar19 + 2;
        } while ((long)uVar19 < lVar20);
      }
      uVar13 = uVar13 + 2;
    } while ((int)uVar13 < iVar2);
  }
  return;
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::Setup(); // Labels solver initialization

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only matter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }